

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.h
# Opt level: O1

Subscriber __thiscall
miniros::NodeHandle::subscribe<rosgraph_msgs::Log_<std::allocator<void>>,miniros::master::Rosout>
          (NodeHandle *this,string *topic,uint32_t queue_size,offset_in_Rosout_to_subr fp,
          Rosout *obj,TransportHints *transport_hints)

{
  undefined4 in_register_00000014;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Subscriber SVar1;
  undefined8 in_stack_00000008;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000010;
  SubscribeOptions ops;
  _Any_data local_158;
  code *local_148;
  code *pcStack_140;
  _Any_data local_138;
  code *local_128;
  code *local_120;
  SubscribeOptions local_110;
  
  local_110.topic._M_dataplus._M_p = (pointer)&local_110.topic.field_2;
  local_110.topic._M_string_length = 0;
  local_110.topic.field_2._M_local_buf[0] = '\0';
  local_110.queue_size = 1;
  local_110.md5sum._M_dataplus._M_p = (pointer)&local_110.md5sum.field_2;
  local_110.md5sum._M_string_length = 0;
  local_110.md5sum.field_2._M_local_buf[0] = '\0';
  local_110.datatype._M_dataplus._M_p = (pointer)&local_110.datatype.field_2;
  local_110.datatype._M_string_length = 0;
  local_110.datatype.field_2._M_local_buf[0] = '\0';
  local_110.transport_hints.options_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_110.transport_hints.options_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_110.transport_hints.options_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_110.transport_hints.options_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_110.helper.
  super___shared_ptr<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_110.helper.
  super___shared_ptr<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._0_1_ = 0;
  local_110.helper.
  super___shared_ptr<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._1_7_ = 0;
  local_110.callback_queue._0_1_ = 0;
  local_110._121_8_ = 0;
  local_110.tracked_object.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_110.tracked_object.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_110.transport_hints.transports_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_110.transport_hints.transports_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_110.transport_hints.transports_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_110.transport_hints.options_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_148 = (code *)0x0;
  pcStack_140 = (code *)0x0;
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_110.transport_hints.options_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_110.transport_hints.options_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_158._M_unused._M_object = operator_new(0x18);
  *(Rosout **)local_158._M_unused._0_8_ = obj;
  *(TransportHints **)((long)local_158._M_unused._0_8_ + 8) = transport_hints;
  *(undefined8 *)((long)local_158._M_unused._0_8_ + 0x10) = in_stack_00000008;
  pcStack_140 = master::std::
                _Function_handler<void_(const_std::shared_ptr<const_rosgraph_msgs::Log_<std::allocator<void>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/include/miniros/node_handle.h:472:19)>
                ::_M_invoke;
  local_148 = master::std::
              _Function_handler<void_(const_std::shared_ptr<const_rosgraph_msgs::Log_<std::allocator<void>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/include/miniros/node_handle.h:472:19)>
              ::_M_manager;
  local_138._M_unused._M_object = (void *)0x0;
  local_138._8_8_ = 0;
  local_120 = master::std::
              _Function_handler<std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>_>_(),_miniros::DefaultMessageCreator<rosgraph_msgs::Log_<std::allocator<void>_>_>_>
              ::_M_invoke;
  local_128 = master::std::
              _Function_handler<std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>_>_(),_miniros::DefaultMessageCreator<rosgraph_msgs::Log_<std::allocator<void>_>_>_>
              ::_M_manager;
  SubscribeOptions::init<rosgraph_msgs::Log_<std::allocator<void>>>
            (&local_110,(string *)CONCAT44(in_register_00000014,queue_size),(uint32_t)fp,
             (function<void_(const_std::shared_ptr<const_rosgraph_msgs::Log_<std::allocator<void>_>_>_&)>
              *)&local_158,
             (function<std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>_>_()> *)&local_138
            );
  if (local_128 != (code *)0x0) {
    (*local_128)((_Any_data *)&local_138,(_Any_data *)&local_138,__destroy_functor);
  }
  if (local_148 != (code *)0x0) {
    (*local_148)((_Any_data *)&local_158,(_Any_data *)&local_158,__destroy_functor);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&local_110.transport_hints.transports_,in_stack_00000010);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&local_110.transport_hints.options_._M_t,
              (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(in_stack_00000010 + 1));
  subscribe(this,(SubscribeOptions *)topic);
  SubscribeOptions::~SubscribeOptions(&local_110);
  SVar1.impl_.super___shared_ptr<miniros::Subscriber::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  SVar1.impl_.super___shared_ptr<miniros::Subscriber::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Subscriber)
         SVar1.impl_.super___shared_ptr<miniros::Subscriber::Impl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Subscriber subscribe(const std::string& topic, uint32_t queue_size, 
                       void(T::*fp)(const std::shared_ptr<M const>&), T* obj, 
                       const TransportHints& transport_hints = TransportHints())
  {
    SubscribeOptions ops;
    auto wrapFn = [fp, obj](const std::shared_ptr<M const>& msg){(obj->*fp)(msg);};
    ops.template init<M>(topic, queue_size, wrapFn);
    ops.transport_hints = transport_hints;
    return subscribe(ops);
  }